

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::NormalizerSpec::NormalizerSpec(NormalizerSpec *this,NormalizerSpec *from)

{
  bool bVar1;
  InternalMetadata *this_00;
  string *psVar2;
  Arena *pAVar3;
  NormalizerSpec *in_RSI;
  undefined8 *in_RDI;
  NormalizerSpec *in_stack_fffffffffffffec8;
  MessageLite *in_stack_fffffffffffffed0;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  ExtensionSet *in_stack_ffffffffffffff20;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  google::protobuf::MessageLite::MessageLite((MessageLite *)0x45c1a2);
  *in_RDI = &PTR__NormalizerSpec_006f1050;
  google::protobuf::internal::ExtensionSet::ExtensionSet((ExtensionSet *)(in_RDI + 2));
  *(uint32 *)(in_RDI + 5) = (in_RSI->_has_bits_).has_bits_[0];
  google::protobuf::internal::CachedSize::CachedSize((CachedSize *)0x45c1ea);
  this_00 = &(in_RSI->super_MessageLite)._internal_metadata_;
  if (((uint)this_00->ptr_ & 1) == 1) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      (*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              ((InternalMetadata *)in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom
            (in_stack_ffffffffffffff20,
             (ExtensionSet *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    psVar2 = _internal_name_abi_cxx11_(in_stack_fffffffffffffec8);
    pAVar3 = google::protobuf::MessageLite::GetArena(in_stack_fffffffffffffed0);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(in_RDI + 6),psVar2,pAVar3);
  }
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
  bVar1 = _internal_has_precompiled_charsmap(in_RSI);
  if (bVar1) {
    psVar2 = _internal_precompiled_charsmap_abi_cxx11_(in_stack_fffffffffffffec8);
    pAVar3 = google::protobuf::MessageLite::GetArena(in_stack_fffffffffffffed0);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(in_RDI + 7),psVar2,pAVar3);
  }
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
  bVar1 = _internal_has_normalization_rule_tsv(in_RSI);
  if (bVar1) {
    psVar2 = _internal_normalization_rule_tsv_abi_cxx11_(in_stack_fffffffffffffec8);
    pAVar3 = google::protobuf::MessageLite::GetArena(in_stack_fffffffffffffed0);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(in_RDI + 8),psVar2,pAVar3);
  }
  memcpy(in_RDI + 9,&in_RSI->add_dummy_prefix_,3);
  return;
}

Assistant:

NormalizerSpec::NormalizerSpec(const NormalizerSpec& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArena());
  }
  precompiled_charsmap_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_precompiled_charsmap()) {
    precompiled_charsmap_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_precompiled_charsmap(), 
      GetArena());
  }
  normalization_rule_tsv_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_normalization_rule_tsv()) {
    normalization_rule_tsv_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_normalization_rule_tsv(), 
      GetArena());
  }
  ::memcpy(&add_dummy_prefix_, &from.add_dummy_prefix_,
    static_cast<size_t>(reinterpret_cast<char*>(&escape_whitespaces_) -
    reinterpret_cast<char*>(&add_dummy_prefix_)) + sizeof(escape_whitespaces_));
  // @@protoc_insertion_point(copy_constructor:sentencepiece.NormalizerSpec)
}